

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_LASH(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t typ;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t dam;
  wchar_t rad;
  int iVar4;
  wchar_t wVar5;
  monster *mon;
  monster *pmVar6;
  loc finish;
  monster_race *pmVar7;
  monster_blow *pmVar8;
  ulong uVar9;
  long lVar10;
  random_value v;
  source origin;
  
  _Var2 = false;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  wVar1 = context->radius;
  loc(-1,-1);
  if ((context->origin).what == SRC_MONSTER) {
    mon = cave_monster(cave,(context->origin).which.grid.x);
    pmVar6 = monster_target_monster((effect_handler_context_t_conflict *)context);
    if (pmVar6 == (monster *)0x0) {
      _Var2 = monster_is_decoyed(mon);
      if (_Var2) {
        finish = cave_find_decoy(cave);
      }
      else {
        finish.x = (player->grid).x;
        finish.y = (player->grid).y;
      }
    }
    else {
      finish.x = (pmVar6->grid).x;
      finish.y = (pmVar6->grid).y;
    }
    rad = (uint)z_info->max_range;
    if (wVar1 < (int)(uint)z_info->max_range) {
      rad = wVar1;
    }
    pmVar7 = mon->race;
    pmVar8 = pmVar7->blow;
    typ = pmVar8->effect->lash_type;
    if (z_info->mon_blows_max != 0) {
      lVar10 = 0;
      uVar9 = 0;
      do {
        v._8_8_ = *(undefined8 *)((long)&(pmVar8->dice).sides + lVar10);
        v._0_8_ = *(undefined8 *)((long)&(pmVar8->dice).base + lVar10);
        iVar4 = randcalc(v,pmVar7->level,RANDOMISE);
        dam = iVar4 / (int)(2 - (uint)(lVar10 == 0)) + dam;
        pmVar7 = mon->race;
        pmVar8 = pmVar7->blow;
        if (*(long *)((long)&pmVar8->next + lVar10) == 0) break;
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x30;
      } while (uVar9 < z_info->mon_blows_max);
    }
    if (dam == L'\0') {
      _Var2 = false;
    }
    else {
      wVar5 = L'\x19';
      if (wVar1 < L'\x19') {
        wVar5 = wVar1;
      }
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      _Var3 = project(origin,rad,finish,dam,typ,L'౰',L'\0',(uint8_t)wVar5,context->obj);
      _Var2 = true;
      if (_Var3) {
        context->ident = true;
      }
    }
  }
  return _Var2;
}

Assistant:

bool effect_handler_LASH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;

	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_ARC;
	int type;

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	/* Monsters only */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int i;

		flg |= PROJECT_PLAY;

		/* Target player or monster? */
		if (t_mon) {
			target = t_mon->grid;
		} else {
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		/* Paranoia */
		if (rad > z_info->max_range) rad = z_info->max_range;

		/* Get the type (default is PROJ_MISSILE) */
		type = mon->race->blow[0].effect->lash_type;

		/* Scan through all blows for damage */
		for (i = 0; i < z_info->mon_blows_max; i++) {
			/* Extract the attack infomation */
			random_value dice = mon->race->blow[i].dice;

			/* Full damage of first blow, plus half damage of others */
			dam += randcalc(dice, mon->race->level, RANDOMISE) / (i ? 2 : 1);
			if (!mon->race->blow[i].next) break;
		}

		/* No damaging blows */
		if (!dam) return false;
	} else {
		return false;
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Lash the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}